

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender __thiscall
fmt::v9::detail::write_int_noinline<char,fmt::v9::appender,unsigned_long>
          (detail *this,appender out,write_int_arg<unsigned_long> arg,
          basic_format_specs<char> *specs,locale_ref loc)

{
  ulong uVar1;
  presentation_type pVar2;
  size_t sVar3;
  uint uVar4;
  char *digits;
  appender aVar5;
  long lVar6;
  byte *pbVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  basic_format_specs<char> *specs_00;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar11;
  char *pcVar12;
  char *pcVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  format_decimal_result<char_*> fVar18;
  write_int_data<char> data;
  char buffer [20];
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_90;
  write_int_data<char> local_88;
  anon_class_40_3_03e05ccd_conflict local_78;
  
  specs_00 = arg._8_8_;
  pVar2 = specs_00->type;
  uVar10 = (uint)arg.abs_value;
  local_90.container = (buffer<char> *)this;
  local_78.write_digits.abs_value =
       (unsigned_long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  switch(pVar2) {
  case none:
  case dec:
    if (((specs_00->field_0xa & 1) != 0) &&
       (bVar17 = write_int_localized<fmt::v9::appender,unsigned_long,char>
                           ((appender *)&local_90,
                            (unsigned_long)
                            out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                            ,uVar10,specs_00,(locale_ref)specs), bVar17)) {
      return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)local_90.container;
    }
    this = (detail *)local_90.container;
    lVar15 = 0x3f;
    if (((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container | 1) != 0)
    {
      for (; ((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container | 1)
             >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    iVar14 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar15] -
             (uint)((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                   < *(buffer<char> **)
                      (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                      (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar15] * 8));
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char>::write_int_data(&local_88,iVar14,uVar10,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.prefix = uVar10;
      local_78.write_digits.num_digits = iVar14;
      aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_long>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_long>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_)::_lambda(fmt::v9::appender)_1_&>
                        ((appender)this,specs_00,local_88.size,local_88.size,
                         (anon_class_40_3_03e05ccd *)&local_78);
      return (appender)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    if (iVar14 < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                  ,0x199,"negative value");
    }
    if ((uVar10 != 0) &&
       (uVar10 = uVar10 & 0xffffff,
       ((undefined1  [16])arg & (undefined1  [16])0xffffff) != (undefined1  [16])0x0)) {
      do {
        if (((buffer<char> *)this)->capacity_ < ((buffer<char> *)this)->size_ + 1) {
          (**((buffer<char> *)this)->_vptr_buffer)(this);
        }
        sVar3 = ((buffer<char> *)this)->size_;
        ((buffer<char> *)this)->size_ = sVar3 + 1;
        ((buffer<char> *)this)->ptr_[sVar3] = (char)uVar10;
        bVar17 = 0xff < uVar10;
        uVar10 = uVar10 >> 8;
      } while (bVar17);
    }
    fVar18 = format_decimal<char,unsigned_long>
                       ((char *)&local_78,
                        (unsigned_long)
                        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,
                        iVar14);
    pcVar8 = fVar18.end;
    break;
  case oct:
    bVar11 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      lVar15 = lVar16 + 1;
      bVar17 = (buffer<char> *)0x7 < bVar11.container;
      bVar11.container = bVar11.container >> 3;
    } while (bVar17);
    iVar14 = (int)lVar15;
    if (((specs_00->field_0x9 & 0x80) != 0) &&
       (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container !=
        (buffer<char> *)0x0 && specs_00->precision <= iVar14)) {
      uVar9 = 0x3000;
      if (uVar10 == 0) {
        uVar9 = 0x30;
      }
      uVar10 = (uVar9 | uVar10) + 0x1000000;
    }
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char>::write_int_data(&local_88,iVar14,uVar10,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.prefix = uVar10;
      local_78.write_digits.num_digits = iVar14;
      aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_long>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_long>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_)::_lambda(fmt::v9::appender)_1_&>
                        ((appender)this,specs_00,local_88.size,local_88.size,
                         (anon_class_40_3_03e05ccd *)&local_78);
      return (appender)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    if ((uVar10 != 0) && (uVar9 = uVar10 & 0xffffff, (uVar10 & 0xffffff) != 0)) {
      do {
        if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + 1U) {
          (*(code *)**(undefined8 **)this)(this);
        }
        lVar6 = *(long *)(this + 0x10);
        *(long *)(this + 0x10) = lVar6 + 1;
        *(char *)(*(long *)(this + 8) + lVar6) = (char)uVar9;
        bVar17 = 0xff < uVar9;
        uVar9 = uVar9 >> 8;
      } while (bVar17);
    }
    lVar6 = *(long *)(this + 0x10);
    uVar1 = lVar6 + lVar15;
    if (*(ulong *)(this + 0x18) < uVar1) {
      lVar6 = 0;
    }
    else {
      *(ulong *)(this + 0x10) = uVar1;
      lVar6 = lVar6 + *(long *)(this + 8);
    }
    if (lVar6 != 0) {
      pbVar7 = (byte *)(lVar6 + lVar15);
      do {
        pbVar7 = pbVar7 + -1;
        *pbVar7 = SUB81(out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,0)
                  & 7 | 0x30;
        bVar17 = (buffer<char> *)0x7 <
                 (ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             (buffer<char> *)
             ((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container >> 3);
      } while (bVar17);
      return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)this;
    }
    pbVar7 = (byte *)((long)&local_78.prefix + lVar16);
    pcVar8 = (char *)((long)&local_78.prefix + lVar16 + 1);
    do {
      *pbVar7 = SUB81(out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,0) &
                7 | 0x30;
      pbVar7 = pbVar7 + -1;
      bVar17 = (buffer<char> *)0x7 <
               (ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
      out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
           (buffer<char> *)
           ((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container >> 3);
    } while (bVar17);
    break;
  case hex_lower:
  case hex_upper:
    if ((specs_00->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar2 != hex_upper) << 0xd | 0x5830;
      uVar9 = uVar4 << 8;
      if (uVar10 == 0) {
        uVar9 = uVar4;
      }
      uVar10 = (uVar9 | uVar10) + 0x2000000;
    }
    bVar11 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      lVar15 = lVar16 + 1;
      bVar17 = (buffer<char> *)0xf < bVar11.container;
      bVar11.container = bVar11.container >> 4;
    } while (bVar17);
    if (specs_00->precision != -1 || specs_00->width != 0) {
      lVar16 = ((ulong)(pVar2 == hex_upper) << 0x20) + lVar15;
      write_int_data<char>::write_int_data(&local_88,(int)lVar15,uVar10,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.write_digits.num_digits = (int)lVar16;
      local_78.write_digits.upper = SUB81((ulong)lVar16 >> 0x20,0);
      local_78.prefix = uVar10;
      aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_long>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_long>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_)::_lambda(fmt::v9::appender)_1_&>
                        ((appender)this,specs_00,local_88.size,local_88.size,&local_78);
      return (appender)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    if ((uVar10 != 0) && (uVar9 = uVar10 & 0xffffff, (uVar10 & 0xffffff) != 0)) {
      do {
        if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + 1U) {
          (*(code *)**(undefined8 **)this)(this);
        }
        lVar6 = *(long *)(this + 0x10);
        *(long *)(this + 0x10) = lVar6 + 1;
        *(char *)(*(long *)(this + 8) + lVar6) = (char)uVar9;
        bVar17 = 0xff < uVar9;
        uVar9 = uVar9 >> 8;
      } while (bVar17);
    }
    lVar6 = *(long *)(this + 0x10);
    uVar1 = lVar6 + lVar15;
    if (*(ulong *)(this + 0x18) < uVar1) {
      lVar6 = 0;
    }
    else {
      *(ulong *)(this + 0x10) = uVar1;
      lVar6 = lVar6 + *(long *)(this + 8);
    }
    if (lVar6 != 0) {
      pcVar8 = "0123456789abcdef";
      if (pVar2 == hex_upper) {
        pcVar8 = "0123456789ABCDEF";
      }
      pcVar12 = (char *)(lVar6 + lVar15);
      do {
        pcVar12 = pcVar12 + -1;
        *pcVar12 = pcVar8[SUB84(out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                container,0) & 0xf];
        bVar17 = (buffer<char> *)0xf <
                 (ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             (buffer<char> *)
             ((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container >> 4);
      } while (bVar17);
      return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)this;
    }
    pcVar12 = (char *)((long)&local_78.prefix + lVar16);
    pcVar8 = (char *)((long)&local_78.prefix + lVar16 + 1);
    pcVar13 = "0123456789abcdef";
    if (pVar2 == hex_upper) {
      pcVar13 = "0123456789ABCDEF";
    }
    do {
      *pcVar12 = pcVar13[SUB84(out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                               container,0) & 0xf];
      pcVar12 = pcVar12 + -1;
      bVar17 = (buffer<char> *)0xf <
               (ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
      out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
           (buffer<char> *)
           ((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container >> 4);
    } while (bVar17);
    break;
  case bin_lower:
  case bin_upper:
    if ((specs_00->field_0x9 & 0x80) != 0) {
      uVar4 = (uint)(pVar2 != bin_upper) << 0xd | 0x4230;
      uVar9 = uVar4 << 8;
      if (uVar10 == 0) {
        uVar9 = uVar4;
      }
      uVar10 = (uVar9 | uVar10) + 0x2000000;
    }
    bVar11 = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    lVar15 = 0;
    do {
      lVar16 = lVar15;
      lVar15 = lVar16 + 1;
      bVar17 = (buffer<char> *)0x1 < bVar11.container;
      bVar11.container = bVar11.container >> 1;
    } while (bVar17);
    if (specs_00->precision != -1 || specs_00->width != 0) {
      write_int_data<char>::write_int_data(&local_88,(int)lVar15,uVar10,specs_00);
      local_78.data.size = local_88.size;
      local_78.data.padding = local_88.padding;
      local_78.prefix = uVar10;
      local_78.write_digits.num_digits = (int)lVar15;
      aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::write_int<fmt::v9::appender,char,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_long>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_>(fmt::v9::appender,int,unsigned_int,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::write_int<char,fmt::v9::appender,unsigned_long>(fmt::v9::appender,fmt::v9::detail::write_int_arg<unsigned_long>,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_)::_lambda(fmt::v9::appender)_1_&>
                        ((appender)this,specs_00,local_88.size,local_88.size,
                         (anon_class_40_3_03e05ccd *)&local_78);
      return (appender)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
    }
    if ((uVar10 != 0) && (uVar9 = uVar10 & 0xffffff, (uVar10 & 0xffffff) != 0)) {
      do {
        if (*(ulong *)(this + 0x18) < *(long *)(this + 0x10) + 1U) {
          (*(code *)**(undefined8 **)this)(this);
        }
        lVar6 = *(long *)(this + 0x10);
        *(long *)(this + 0x10) = lVar6 + 1;
        *(char *)(*(long *)(this + 8) + lVar6) = (char)uVar9;
        bVar17 = 0xff < uVar9;
        uVar9 = uVar9 >> 8;
      } while (bVar17);
    }
    lVar6 = *(long *)(this + 0x10);
    uVar1 = lVar6 + lVar15;
    if (*(ulong *)(this + 0x18) < uVar1) {
      lVar6 = 0;
    }
    else {
      *(ulong *)(this + 0x10) = uVar1;
      lVar6 = lVar6 + *(long *)(this + 8);
    }
    if (lVar6 != 0) {
      pbVar7 = (byte *)(lVar6 + lVar15);
      do {
        pbVar7 = pbVar7 + -1;
        *pbVar7 = SUB81(out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,0)
                  & 1 | 0x30;
        bVar17 = (buffer<char> *)0x1 <
                 (ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
        out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             (buffer<char> *)
             ((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container >> 1);
      } while (bVar17);
      return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)this;
    }
    pbVar7 = (byte *)((long)&local_78.prefix + lVar16);
    pcVar8 = (char *)((long)&local_78.prefix + lVar16 + 1);
    do {
      *pbVar7 = SUB81(out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,0) &
                1 | 0x30;
      pbVar7 = pbVar7 + -1;
      bVar17 = (buffer<char> *)0x1 <
               (ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
      out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container =
           (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
           (buffer<char> *)
           ((ulong)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container >> 1);
    } while (bVar17);
    break;
  default:
    throw_format_error("invalid type specifier");
  case chr:
    local_78.prefix._0_2_ =
         CONCAT11((char)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container,
                  pVar2 == debug);
    aVar5 = write_padded<(fmt::v9::align::type)1,fmt::v9::appender,char,fmt::v9::detail::write_char<char,fmt::v9::appender>(fmt::v9::appender,char,fmt::v9::basic_format_specs<char>const&)::_lambda(fmt::v9::appender)_1_&>
                      ((appender)this,specs_00,1,1,(anon_class_2_2_bf5026b7 *)&local_78);
    return (appender)
           aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
  }
  aVar5 = copy_str_noinline<char,char*,fmt::v9::appender>((char *)&local_78,pcVar8,(appender)this);
  return (appender)
         aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}